

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O1

TString * internshrstr(lua_State *L,char *str,size_t l)

{
  int *piVar1;
  int iVar2;
  global_State *pgVar3;
  int iVar4;
  size_t sVar5;
  TString *pTVar6;
  uint uVar7;
  uint uVar8;
  TString **ppTVar9;
  
  pgVar3 = L->l_G;
  uVar7 = pgVar3->seed ^ (uint)l;
  sVar5 = l;
  if (l != 0) {
    do {
      uVar7 = uVar7 ^ (uint)(byte)str[sVar5 - 1] + (uVar7 >> 2) + uVar7 * 0x20;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
  }
  ppTVar9 = (pgVar3->strt).hash;
  iVar2 = (pgVar3->strt).size;
  uVar8 = iVar2 - 1U & uVar7;
  pTVar6 = ppTVar9[uVar8];
  while( true ) {
    if (pTVar6 == (TString *)0x0) {
      if ((pgVar3->strt).nuse < iVar2) {
        ppTVar9 = ppTVar9 + uVar8;
      }
      else {
        if ((pgVar3->strt).nuse == 0x7fffffff) {
          internshrstr_cold_1();
        }
        iVar2 = (pgVar3->strt).size;
        if (iVar2 < 0x40000000) {
          luaS_resize(L,iVar2 * 2);
        }
        ppTVar9 = (pgVar3->strt).hash + ((pgVar3->strt).size - 1U & uVar7);
      }
      pTVar6 = (TString *)luaC_newobj(L,'\x04',l + 0x19);
      pTVar6->hash = uVar7;
      pTVar6->extra = '\0';
      pTVar6->shrlen = (ls_byte)l;
      *(undefined1 *)((long)&pTVar6->contents + l) = 0;
      memcpy(&pTVar6->contents,str,l);
      (pTVar6->u).hnext = *ppTVar9;
      *ppTVar9 = pTVar6;
      piVar1 = &(pgVar3->strt).nuse;
      *piVar1 = *piVar1 + 1;
      return pTVar6;
    }
    if (((uint)(int)pTVar6->shrlen == l) && (iVar4 = bcmp(str,&pTVar6->contents,l), iVar4 == 0))
    break;
    pTVar6 = (pTVar6->u).hnext;
  }
  if (((pgVar3->currentwhite ^ 0x18) & pTVar6->marked) == 0) {
    return pTVar6;
  }
  pTVar6->marked = pTVar6->marked ^ 0x18;
  return pTVar6;
}

Assistant:

static TString *internshrstr (lua_State *L, const char *str, size_t l) {
  TString *ts;
  global_State *g = G(L);
  stringtable *tb = &g->strt;
  unsigned int h = luaS_hash(str, l, g->seed);
  TString **list = &tb->hash[lmod(h, tb->size)];
  lua_assert(str != NULL);  /* otherwise 'memcmp'/'memcpy' are undefined */
  for (ts = *list; ts != NULL; ts = ts->u.hnext) {
    if (l == cast_uint(ts->shrlen) &&
        (memcmp(str, getshrstr(ts), l * sizeof(char)) == 0)) {
      /* found! */
      if (isdead(g, ts))  /* dead (but not collected yet)? */
        changewhite(ts);  /* resurrect it */
      return ts;
    }
  }
  /* else must create a new string */
  if (tb->nuse >= tb->size) {  /* need to grow string table? */
    growstrtab(L, tb);
    list = &tb->hash[lmod(h, tb->size)];  /* rehash with new size */
  }
  ts = createstrobj(L, sizestrshr(l), LUA_VSHRSTR, h);
  ts->shrlen = cast(ls_byte, l);
  getshrstr(ts)[l] = '\0';  /* ending 0 */
  memcpy(getshrstr(ts), str, l * sizeof(char));
  ts->u.hnext = *list;
  *list = ts;
  tb->nuse++;
  return ts;
}